

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O2

shared_ptr<aeron::Subscription> __thiscall
aeron::archive::AeronArchive::replay
          (AeronArchive *this,int64_t recordingId,int64_t position,int64_t length,
          string *replayChannel,int32_t replayStreamId,on_available_image_t *availableImageHandler,
          on_unavailable_image_t *unavailableImageHandler)

{
  long lVar1;
  int64_t iVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_0000008c;
  shared_ptr<aeron::Subscription> sVar3;
  string updatedReplayChannel;
  undefined1 local_60 [16];
  string local_50;
  
  iVar2 = startReplay((AeronArchive *)recordingId,position,length,(int64_t)replayChannel,
                      (string *)CONCAT44(in_register_0000008c,replayStreamId),
                      (int32_t)availableImageHandler);
  ChannelUri::addSessionId
            (&local_50,(string *)CONCAT44(in_register_0000008c,replayStreamId),(int32_t)iVar2);
  ClientConductor::addSubscription
            ((ClientConductor *)(*(long *)(recordingId + 0x128) + 0x24b0),&local_50,
             (int32_t)availableImageHandler,unavailableImageHandler,
             (on_unavailable_image_t *)updatedReplayChannel._M_dataplus._M_p);
  (this->ctx_).cfg_.messageTimeoutNs = 0;
  (this->ctx_).cfg_.controlChannel._M_dataplus._M_p = (pointer)0x0;
  while( true ) {
    ClientConductor::findSubscription
              ((ClientConductor *)local_60,*(long *)(recordingId + 0x128) + 0x24b0);
    std::__shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2> *)local_60);
    lVar1 = (this->ctx_).cfg_.messageTimeoutNs;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
    if (lVar1 != 0) break;
    sched_yield();
  }
  std::__cxx11::string::~string((string *)&local_50);
  sVar3.super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<aeron::Subscription>)
         sVar3.super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<aeron::Subscription> AeronArchive::replay(std::int64_t recordingId, std::int64_t position,
                                                          std::int64_t length, const std::string& replayChannel,
                                                          std::int32_t replayStreamId,
                                                          aeron::on_available_image_t&& availableImageHandler,
                                                          aeron::on_unavailable_image_t&& unavailableImageHandler) {
    std::int64_t replaySessionId = startReplay(recordingId, position, length, replayChannel, replayStreamId);

    std::string updatedReplayChannel = ChannelUri::addSessionId(replayChannel, replaySessionId);

    // wait for the subscription to become available
    std::int64_t subId = aeron_->addSubscription(updatedReplayChannel, replayStreamId, std::move(availableImageHandler),
                                                 std::move(unavailableImageHandler));

    std::shared_ptr<Subscription> subscription;
    while (!(subscription = aeron_->findSubscription(subId))) {
        std::this_thread::yield();
    }

    return subscription;
}